

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          unsigned_long params_3)

{
  string *value;
  unsigned_long in_stack_ffffffffffffff30;
  string local_c8 [32];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_a8;
  undefined1 local_88 [56];
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)local_88,(string *)values);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_88 + 0x20),(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)(local_88 + 0x20));
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)param);
  ::std::__cxx11::string::string(local_c8,(string *)params_1);
  ConstructMessageRecursive<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
            (__return_storage_ptr__,this,msg,&local_a8,params,(unsigned_long)local_c8,params_2,
             in_stack_ffffffffffffff30);
  ::std::__cxx11::string::~string(local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}